

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_3;
  SpecparamDeclaratorSyntax *pSVar1;
  Token local_78;
  Token local_68;
  Token local_58;
  DeepCloneVisitor visitor_1;
  SyntaxNode *local_38;
  DeepCloneVisitor visitor;
  
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_78 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x48),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_38 = (SyntaxNode *)0x0;
  }
  else {
    local_38 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SpecparamDeclaratorSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_58,&local_68,&local_78,
                      (ExpressionSyntax *)args_3,(Token *)&visitor,(ExpressionSyntax **)&local_38,
                      (Token *)&visitor_1);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SpecparamDeclaratorSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SpecparamDeclaratorSyntax>(
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.value1, alloc),
        node.comma.deepClone(alloc),
        node.value2 ? deepClone(*node.value2, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}